

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Method_Wrapper *in_value)

{
  uint *puVar1;
  Am_Wrapper *pAVar2;
  Am_Value_Type AVar3;
  int iVar4;
  
  if (((short)this->type < 0) && (pAVar2 = (this->value).wrapper_value, pAVar2 != (Am_Wrapper *)0x0)
     ) {
    puVar1 = &pAVar2->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
    }
  }
  if (in_value == (Am_Method_Wrapper *)0x0) {
    AVar3 = 0x3000;
  }
  else {
    iVar4 = (**(in_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(in_value);
    AVar3 = (Am_Value_Type)iVar4;
  }
  this->type = AVar3;
  (this->value).method_value = in_value;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(Am_Method_Wrapper *in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  if (in_value)
    type = (Am_Value_Type)in_value->ID();
  else
    type = Am_METHOD_TYPE;
  value.method_value = in_value;
  return *this;
}